

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpElementCP<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
               (OpCode op,OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  ushort uVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  PropertyId propertyId_00;
  ScriptContext *this;
  PropertyRecord *this_00;
  char16 *pcVar5;
  undefined4 *puVar6;
  PropertyRecord *pPropertyName;
  PropertyId propertyId;
  ScriptContext *scriptContext;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data_local;
  OpCode op_local;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId_00 = FunctionBody::GetPropertyIdFromCacheId(dumpFunction,(uint)data->inlineCacheIndex);
  this_00 = ScriptContext::GetPropertyName(this,propertyId_00);
  switch(op) {
  case InitLetFld:
  case InitConstFld:
  case InitClassMember:
  case StFld:
  case StFldStrict:
  case InitFld:
    uVar1 = data->Instance;
    pcVar5 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" R%d.%s = R%d #%d",(ulong)uVar1,pcVar5,(ulong)data->Value,
                  (ulong)data->inlineCacheIndex);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x453,"(false)","Unknown OpCode for OpLayoutElementCP");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
    break;
  case LdFld:
  case LdFld_ReuseLoc:
  case LdFldForTypeOf:
  case LdFldForCallApplyTarget:
  case LdMethodFld:
  case ScopedLdMethodFld:
  case LdLen_A:
    uVar1 = data->Value;
    uVar2 = data->Instance;
    pcVar5 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" R%d = R%d.%s #%d",(ulong)uVar1,(ulong)uVar2,pcVar5,
                  (ulong)data->inlineCacheIndex);
    break;
  case ProfiledLdFld:
  case ProfiledLdFld_ReuseLoc:
  case ProfiledLdFldForTypeOf:
  case ProfiledLdFldForCallApplyTarget:
  case ProfiledLdMethodFld:
    uVar1 = data->Value;
    uVar2 = data->Instance;
    pcVar5 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" R%d = R%d.%s #%d",(ulong)uVar1,(ulong)uVar2,pcVar5,
                  (ulong)data->inlineCacheIndex);
    DumpProfileId((uint)data->inlineCacheIndex);
    break;
  case ProfiledStFld:
  case ProfiledStFldStrict:
  case ProfiledInitFld:
    uVar1 = data->Instance;
    pcVar5 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" R%d.%s = R%d #%d",(ulong)uVar1,pcVar5,(ulong)data->Value,
                  (ulong)data->inlineCacheIndex);
    DumpProfileId((uint)data->inlineCacheIndex);
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpElementCP(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyId propertyId = dumpFunction->GetPropertyIdFromCacheId(data->inlineCacheIndex);
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(propertyId);
        switch (op)
        {
            case OpCode::LdLen_A:
            case OpCode::LdFldForTypeOf:
            case OpCode::LdFld:
            case OpCode::LdFld_ReuseLoc:
            case OpCode::LdFldForCallApplyTarget:
            case OpCode::LdMethodFld:
            case OpCode::ScopedLdMethodFld:
            {
                Output::Print(_u(" R%d = R%d.%s #%d"), data->Value, data->Instance,
                        pPropertyName->GetBuffer(), data->inlineCacheIndex);
                break;
            }
            case OpCode::InitFld:
            case OpCode::InitLetFld:
            case OpCode::InitConstFld:
            case OpCode::StFld:
            case OpCode::StFldStrict:
            case OpCode::InitClassMember:
            {
                Output::Print(_u(" R%d.%s = R%d #%d"), data->Instance, pPropertyName->GetBuffer(),
                        data->Value, data->inlineCacheIndex);
                break;
            }
            case OpCode::ProfiledLdFldForTypeOf:
            case OpCode::ProfiledLdFld:
            case OpCode::ProfiledLdFld_ReuseLoc:
            case OpCode::ProfiledLdFldForCallApplyTarget:
            case OpCode::ProfiledLdMethodFld:
            {
                Output::Print(_u(" R%d = R%d.%s #%d"), data->Value, data->Instance,
                        pPropertyName->GetBuffer(), data->inlineCacheIndex);
                DumpProfileId(data->inlineCacheIndex);
                break;
            }
            case OpCode::ProfiledInitFld:
            case OpCode::ProfiledStFld:
            case OpCode::ProfiledStFldStrict:
            {
                Output::Print(_u(" R%d.%s = R%d #%d"), data->Instance, pPropertyName->GetBuffer(),
                        data->Value, data->inlineCacheIndex);
                DumpProfileId(data->inlineCacheIndex);
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementCP");
                break;
            }
        }
    }